

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

FrameBuffer * __thiscall Imf_3_4::ScanLineInputFile::frameBuffer(ScanLineInputFile *this)

{
  element_type *peVar1;
  mutex *__mutex;
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_mx;
  std::mutex::lock(__mutex);
  peVar1 = (this->_data).
           super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return &peVar1->frameBuffer;
}

Assistant:

const FrameBuffer&
ScanLineInputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    return _data->frameBuffer;
}